

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::CreateAnimation(BVHLoader *this,aiScene *pScene)

{
  aiNode *paVar1;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  aiAnimation **ppaVar5;
  aiAnimation *this_00;
  size_type sVar6;
  ulong uVar7;
  aiNodeAnim **ppaVar8;
  aiNodeAnim *this_01;
  const_reference __k;
  uint *puVar9;
  aiVectorKey *paVar10;
  DeadlyImportError *pDVar11;
  pointer ppVar12;
  vector<float,_std::allocator<float>_> *pvVar13;
  const_reference pvVar14;
  aiQuatKey *paVar15;
  aiVectorKey *local_360;
  aiQuatKey *local_318;
  aiVectorKey *local_2f0;
  aiVectorKey *local_288;
  double local_230;
  double local_228;
  aiMatrix3x3t<float> local_220;
  aiMatrix3x3t<float> local_1fc;
  aiMatrix3x3t<float> local_1d8;
  float local_1b4;
  int local_1b0;
  float angle;
  int channelIdx_1;
  _Self local_188;
  _Self local_180;
  iterator mapIter_1;
  undefined1 local_170 [4];
  ChannelType channel_2;
  aiMatrix3x3 rotMatrix;
  aiMatrix4x4 temp;
  uint fr_1;
  aiQuatKey *rotkey;
  aiVector3D nodePos;
  int channelIdx;
  _Self local_c8;
  _Self local_c0;
  iterator mapIter;
  ChannelType channel_1;
  uint fr;
  aiVectorKey *poskey;
  undefined1 local_a0 [4];
  uint channel;
  map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
  channelMap;
  aiNodeAnim *nodeAnim;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string nodeName;
  Node *node;
  uint a;
  uint i;
  aiAnimation *anim;
  aiScene *pScene_local;
  BVHLoader *this_local;
  
  pScene->mNumAnimations = 1;
  ppaVar5 = (aiAnimation **)operator_new__(8);
  pScene->mAnimations = ppaVar5;
  this_00 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this_00);
  *pScene->mAnimations = this_00;
  aiString::Set((aiString *)this_00,"Motion");
  this_00->mTicksPerSecond = 1.0 / (double)this->mAnimTickDuration;
  this_00->mDuration = (double)(this->mAnimNumFrames - 1);
  sVar6 = std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::size
                    (&this->mNodes);
  this_00->mNumChannels = (uint)sVar6;
  auVar3 = ZEXT416(this_00->mNumChannels) * ZEXT816(8);
  uVar7 = auVar3._0_8_;
  if (auVar3._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  ppaVar8 = (aiNodeAnim **)operator_new__(uVar7);
  this_00->mChannels = ppaVar8;
  for (node._4_4_ = 0; node._4_4_ < this_00->mNumChannels; node._4_4_ = node._4_4_ + 1) {
    this_00->mChannels[node._4_4_] = (aiNodeAnim *)0x0;
  }
  node._0_4_ = 0;
  do {
    if (this_00->mNumChannels <= (uint)node) {
      return;
    }
    nodeName.field_2._8_8_ =
         std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::operator[]
                   (&this->mNodes,(ulong)(uint)node);
    paVar1 = ((reference)nodeName.field_2._8_8_)->mNode;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(paVar1->mName).data,&local_51);
    std::allocator<char>::~allocator(&local_51);
    this_01 = (aiNodeAnim *)operator_new(0x438);
    aiNodeAnim::aiNodeAnim(this_01);
    this_00->mChannels[(uint)node] = this_01;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_01;
    aiString::Set((aiString *)this_01,(string *)local_50);
    std::
    map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
    ::map((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
           *)local_a0);
    for (poskey._4_4_ = 0;
        sVar6 = std::
                vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ::size((vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                        *)(nodeName.field_2._8_8_ + 8)), poskey._4_4_ < sVar6;
        poskey._4_4_ = poskey._4_4_ + 1) {
      __k = std::
            vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
            ::operator[]((vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                          *)(nodeName.field_2._8_8_ + 8),(ulong)poskey._4_4_);
      puVar9 = (uint *)std::
                       map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                       ::operator[]((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                                     *)local_a0,__k);
      *puVar9 = poskey._4_4_;
    }
    sVar6 = std::
            vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
            ::size((vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                    *)(nodeName.field_2._8_8_ + 8));
    if (sVar6 == 6) {
      *(uint *)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x404) =
           this->mAnimNumFrames;
      uVar7 = (ulong)this->mAnimNumFrames;
      paVar10 = (aiVectorKey *)operator_new__(uVar7 * 0x18);
      if (uVar7 != 0) {
        local_288 = paVar10;
        do {
          aiVectorKey::aiVectorKey(local_288);
          local_288 = local_288 + 1;
        } while (local_288 != paVar10 + uVar7);
      }
      *(aiVectorKey **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x408) =
           paVar10;
      _channel_1 = *(double **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x408)
      ;
      for (mapIter._M_node._4_4_ = 0; mapIter._M_node._4_4_ < this->mAnimNumFrames;
          mapIter._M_node._4_4_ = mapIter._M_node._4_4_ + 1) {
        *_channel_1 = (double)mapIter._M_node._4_4_;
        for (mapIter._M_node._0_4_ = 0; (int)mapIter._M_node < 3;
            mapIter._M_node._0_4_ = (int)mapIter._M_node + 1) {
          local_c0._M_node =
               (_Base_ptr)
               std::
               map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
               ::find((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                       *)local_a0,(key_type *)&mapIter);
          local_c8._M_node =
               (_Base_ptr)
               std::
               map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
               ::end((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                      *)local_a0);
          bVar4 = std::operator==(&local_c0,&local_c8);
          if (bVar4) {
            nodePos.z._3_1_ = 1;
            pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &channelIdx,"Missing position channel in node ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50);
            DeadlyImportError::DeadlyImportError(pDVar11,(string *)&channelIdx);
            nodePos.z._3_1_ = 0;
            __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          ppVar12 = std::_Rb_tree_iterator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>::
                    operator->(&local_c0);
          nodePos.y = (float)ppVar12->second;
          if ((int)mapIter._M_node == 0) {
            pvVar13 = (vector<float,_std::allocator<float>_> *)(nodeName.field_2._8_8_ + 0x20);
            uVar7 = (ulong)mapIter._M_node._4_4_;
            sVar6 = std::
                    vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                    ::size((vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                            *)(nodeName.field_2._8_8_ + 8));
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                (pvVar13,uVar7 * sVar6 + (long)(int)nodePos.y);
            *(value_type *)(_channel_1 + 1) = *pvVar14;
          }
          else if ((int)mapIter._M_node == 1) {
            pvVar13 = (vector<float,_std::allocator<float>_> *)(nodeName.field_2._8_8_ + 0x20);
            uVar7 = (ulong)mapIter._M_node._4_4_;
            sVar6 = std::
                    vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                    ::size((vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                            *)(nodeName.field_2._8_8_ + 8));
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                (pvVar13,uVar7 * sVar6 + (long)(int)nodePos.y);
            *(value_type *)((long)_channel_1 + 0xc) = *pvVar14;
          }
          else if ((int)mapIter._M_node == 2) {
            pvVar13 = (vector<float,_std::allocator<float>_> *)(nodeName.field_2._8_8_ + 0x20);
            uVar7 = (ulong)mapIter._M_node._4_4_;
            sVar6 = std::
                    vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                    ::size((vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                            *)(nodeName.field_2._8_8_ + 8));
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                (pvVar13,uVar7 * sVar6 + (long)(int)nodePos.y);
            *(value_type *)(_channel_1 + 2) = *pvVar14;
          }
        }
        _channel_1 = _channel_1 + 3;
      }
    }
    else {
      lVar2 = *(long *)nodeName.field_2._8_8_;
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)((long)&rotkey + 4),*(float *)(lVar2 + 0x410),
                 *(float *)(lVar2 + 0x420),*(float *)(lVar2 + 0x430));
      *(undefined4 *)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x404) = 1;
      paVar10 = (aiVectorKey *)operator_new__(0x18);
      local_2f0 = paVar10;
      do {
        aiVectorKey::aiVectorKey(local_2f0);
        local_2f0 = local_2f0 + 1;
      } while (local_2f0 != paVar10 + 1);
      *(aiVectorKey **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x408) =
           paVar10;
      **(undefined8 **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x408) = 0;
      lVar2 = *(long *)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x408);
      *(undefined8 *)(lVar2 + 8) = stack0xffffffffffffff04;
      *(float *)(lVar2 + 0x10) = nodePos.x;
    }
    *(uint *)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x410) =
         this->mAnimNumFrames;
    uVar7 = (ulong)this->mAnimNumFrames;
    paVar15 = (aiQuatKey *)operator_new__(uVar7 * 0x18);
    if (uVar7 != 0) {
      local_318 = paVar15;
      do {
        aiQuatKey::aiQuatKey(local_318);
        local_318 = local_318 + 1;
      } while (local_318 != paVar15 + uVar7);
    }
    *(aiQuatKey **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x418) = paVar15;
    unique0x00012000 =
         *(double **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x418);
    for (temp.d3 = 0.0; (uint)temp.d3 < this->mAnimNumFrames; temp.d3 = (float)((int)temp.d3 + 1)) {
      aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&rotMatrix.c2);
      aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)local_170);
      for (mapIter_1._M_node._4_4_ = 3; mapIter_1._M_node._4_4_ < 6;
          mapIter_1._M_node._4_4_ = mapIter_1._M_node._4_4_ + 1) {
        local_180._M_node =
             (_Base_ptr)
             std::
             map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
             ::find((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                     *)local_a0,(key_type *)((long)&mapIter_1._M_node + 4));
        local_188._M_node =
             (_Base_ptr)
             std::
             map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
             ::end((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                    *)local_a0);
        bVar4 = std::operator==(&local_180,&local_188);
        if (bVar4) {
          angle._3_1_ = 1;
          pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &channelIdx_1,"Missing rotation channel in node ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          DeadlyImportError::DeadlyImportError(pDVar11,(string *)&channelIdx_1);
          angle._3_1_ = 0;
          __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        ppVar12 = std::_Rb_tree_iterator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>::
                  operator->(&local_180);
        local_1b0 = ppVar12->second;
        pvVar13 = (vector<float,_std::allocator<float>_> *)(nodeName.field_2._8_8_ + 0x20);
        sVar6 = std::
                vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ::size((vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                        *)(nodeName.field_2._8_8_ + 8));
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                            (pvVar13,(uint)temp.d3 * sVar6 + (long)local_1b0);
        local_1b4 = (*pvVar14 * 3.1415927) / 180.0;
        if (mapIter_1._M_node._4_4_ == 3) {
          aiMatrix4x4t<float>::RotationX(local_1b4,(aiMatrix4x4t<float> *)&rotMatrix.c2);
          aiMatrix3x3t<float>::aiMatrix3x3t(&local_1d8,(aiMatrix4x4t<float> *)&rotMatrix.c2);
          aiMatrix3x3t<float>::operator*=((aiMatrix3x3t<float> *)local_170,&local_1d8);
        }
        else if (mapIter_1._M_node._4_4_ == 4) {
          aiMatrix4x4t<float>::RotationY(local_1b4,(aiMatrix4x4t<float> *)&rotMatrix.c2);
          aiMatrix3x3t<float>::aiMatrix3x3t(&local_1fc,(aiMatrix4x4t<float> *)&rotMatrix.c2);
          aiMatrix3x3t<float>::operator*=((aiMatrix3x3t<float> *)local_170,&local_1fc);
        }
        else if (mapIter_1._M_node._4_4_ == 5) {
          aiMatrix4x4t<float>::RotationZ(local_1b4,(aiMatrix4x4t<float> *)&rotMatrix.c2);
          aiMatrix3x3t<float>::aiMatrix3x3t(&local_220,(aiMatrix4x4t<float> *)&rotMatrix.c2);
          aiMatrix3x3t<float>::operator*=((aiMatrix3x3t<float> *)local_170,&local_220);
        }
      }
      *stack0xfffffffffffffef8 = (double)(uint)temp.d3;
      aiQuaterniont<float>::aiQuaterniont
                ((aiQuaterniont<float> *)&local_230,(aiMatrix3x3t<float> *)local_170);
      stack0xfffffffffffffef8[1] = local_230;
      stack0xfffffffffffffef8[2] = local_228;
      register0x00000000 = stack0xfffffffffffffef8 + 3;
    }
    *(undefined4 *)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x420) = 1;
    paVar10 = (aiVectorKey *)operator_new__(0x18);
    local_360 = paVar10;
    do {
      aiVectorKey::aiVectorKey(local_360);
      local_360 = local_360 + 1;
    } while (local_360 != paVar10 + 1);
    *(aiVectorKey **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x428) = paVar10
    ;
    **(undefined8 **)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x428) = 0;
    aiVector3t<float>::Set
              ((aiVector3t<float> *)
               (*(long *)(channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x428) + 8),
               1.0,1.0,1.0);
    std::
    map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
    ::~map((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
            *)local_a0);
    std::__cxx11::string::~string((string *)local_50);
    node._0_4_ = (uint)node + 1;
  } while( true );
}

Assistant:

void BVHLoader::CreateAnimation( aiScene* pScene)
{
    // create the animation
    pScene->mNumAnimations = 1;
    pScene->mAnimations = new aiAnimation*[1];
    aiAnimation* anim = new aiAnimation;
    pScene->mAnimations[0] = anim;

    // put down the basic parameters
    anim->mName.Set( "Motion");
    anim->mTicksPerSecond = 1.0 / double( mAnimTickDuration);
    anim->mDuration = double( mAnimNumFrames - 1);

    // now generate the tracks for all nodes
    anim->mNumChannels = static_cast<unsigned int>(mNodes.size());
    anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // FIX: set the array elements to NULL to ensure proper deletion if an exception is thrown
    for (unsigned int i = 0; i < anim->mNumChannels;++i)
        anim->mChannels[i] = NULL;

    for( unsigned int a = 0; a < anim->mNumChannels; a++)
    {
        const Node& node = mNodes[a];
        const std::string nodeName = std::string( node.mNode->mName.data );
        aiNodeAnim* nodeAnim = new aiNodeAnim;
        anim->mChannels[a] = nodeAnim;
        nodeAnim->mNodeName.Set( nodeName);
		std::map<BVHLoader::ChannelType, int> channelMap;

		//Build map of channels 
		for (unsigned int channel = 0; channel < node.mChannels.size(); ++channel)
		{
			channelMap[node.mChannels[channel]] = channel;
		}

        // translational part, if given
        if( node.mChannels.size() == 6)
        {
            nodeAnim->mNumPositionKeys = mAnimNumFrames;
            nodeAnim->mPositionKeys = new aiVectorKey[mAnimNumFrames];
            aiVectorKey* poskey = nodeAnim->mPositionKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                poskey->mTime = double( fr);

                // Now compute all translations 
                for(BVHLoader::ChannelType channel = Channel_PositionX; channel <= Channel_PositionZ; channel = (BVHLoader::ChannelType)(channel +1))
                {
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing position channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						switch (channel) {
						    case Channel_PositionX: 
                                poskey->mValue.x = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionY: 
                                poskey->mValue.y = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionZ: 
                                poskey->mValue.z = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
                                
                            default:
                                break;
						}

					}
                }
                ++poskey;
            }
        } else
        {
            // if no translation part is given, put a default sequence
            aiVector3D nodePos( node.mNode->mTransformation.a4, node.mNode->mTransformation.b4, node.mNode->mTransformation.c4);
            nodeAnim->mNumPositionKeys = 1;
            nodeAnim->mPositionKeys = new aiVectorKey[1];
            nodeAnim->mPositionKeys[0].mTime = 0.0;
            nodeAnim->mPositionKeys[0].mValue = nodePos;
        }

        // rotation part. Always present. First find value offsets
        {

            // Then create the number of rotation keys
            nodeAnim->mNumRotationKeys = mAnimNumFrames;
            nodeAnim->mRotationKeys = new aiQuatKey[mAnimNumFrames];
            aiQuatKey* rotkey = nodeAnim->mRotationKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                aiMatrix4x4 temp;
                aiMatrix3x3 rotMatrix;
				for (BVHLoader::ChannelType channel = Channel_RotationX; channel <= Channel_RotationZ; channel = (BVHLoader::ChannelType)(channel + 1))
				{
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing rotation channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						// translate ZXY euler angels into a quaternion
						const float angle = node.mChannelValues[fr * node.mChannels.size() + channelIdx] * float(AI_MATH_PI) / 180.0f;

						// Compute rotation transformations in the right order
						switch (channel)
						{
							case Channel_RotationX: 
                                aiMatrix4x4::RotationX(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
							case Channel_RotationY: 
                                aiMatrix4x4::RotationY(angle, temp); rotMatrix *= aiMatrix3x3(temp);  
                                break;
							case Channel_RotationZ: aiMatrix4x4::RotationZ(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
                            default:
                                break;
						}
					}
                }

                rotkey->mTime = double( fr);
                rotkey->mValue = aiQuaternion( rotMatrix);
                ++rotkey;
            }
        }

        // scaling part. Always just a default track
        {
            nodeAnim->mNumScalingKeys = 1;
            nodeAnim->mScalingKeys = new aiVectorKey[1];
            nodeAnim->mScalingKeys[0].mTime = 0.0;
            nodeAnim->mScalingKeys[0].mValue.Set( 1.0f, 1.0f, 1.0f);
        }
    }
}